

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralSubstitutionTree.hpp
# Opt level: O1

VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs> __thiscall
Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::getAll
          (LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *this)

{
  long *plVar1;
  _func_int **pp_Var2;
  anon_class_8_1_8991fb9c_for__func in_RSI;
  undefined1 local_1d0 [40];
  OptionBase<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LeafIterator>
  local_1a8;
  char local_178;
  long *local_170;
  undefined1 local_168 [8];
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_LiteralSubstitutionTree_hpp:57:21),_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LeafIterator>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_LiteralSubstitutionTree_hpp:58:21),_Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>_>_>
  local_160;
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_LiteralSubstitutionTree_hpp:57:21),_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LeafIterator>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_LiteralSubstitutionTree_hpp:58:21),_Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>_>_>
  local_f0;
  undefined8 local_88;
  undefined8 uStack_80;
  long local_78;
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_LiteralSubstitutionTree_hpp:57:21),_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LeafIterator>_>_>
  local_68;
  
  local_78 = (long)((in_RSI.this)->_trees)._cursor - (long)((in_RSI.this)->_trees)._stack >> 3;
  local_88 = 0;
  uStack_80 = 0;
  ::Lib::IterTraits<Lib::RangeIterator<unsigned_long>>::
  flatMap<Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::getAll()::_lambda(auto:1)_1_>
            (&local_68,(IterTraits<Lib::RangeIterator<unsigned_long>> *)&local_88,in_RSI);
  ::Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::getAll()::{lambda(auto:1)#1},Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LeafIterator>>>
  ::
  flatMap<Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::getAll()::_lambda(Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Leaf*)_1_>
            (local_1d0,&local_68);
  ::Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::getAll()::{lambda(auto:1)#1},Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LeafIterator>>,Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::getAll()::{lambda(Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Leaf*)#1},Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs*>>>>
  ::
  map<Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::getAll()::_lambda(Inferences::ALASCA::BinaryResolutionConf::Rhs_const*)_1_>
            (local_168,local_1d0);
  pp_Var2 = (_func_int **)::operator_new(0x80,8);
  ::Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/LiteralSubstitutionTree.hpp:57:21),_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LeafIterator>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/LiteralSubstitutionTree.hpp:58:21),_Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>_>_>
  ::FlatteningIterator(&local_f0,&local_160);
  *(undefined4 *)(pp_Var2 + 1) = 0;
  *pp_Var2 = (_func_int *)&PTR__ProxyIterator_00b5a090;
  ::Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/LiteralSubstitutionTree.hpp:57:21),_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LeafIterator>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/LiteralSubstitutionTree.hpp:58:21),_Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>_>_>
  ::FlatteningIterator
            ((FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_LiteralSubstitutionTree_hpp:57:21),_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LeafIterator>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_LiteralSubstitutionTree_hpp:58:21),_Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>_>_>
              *)(pp_Var2 + 3),&local_f0);
  *(int *)(pp_Var2 + 1) = *(int *)(pp_Var2 + 1) + 1;
  (this->super_LiteralIndexingStructure<Inferences::ALASCA::BinaryResolutionConf::Rhs>).
  _vptr_LiteralIndexingStructure = pp_Var2;
  if ((local_f0._current.
       super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>_>.
       _isSome == true) &&
     (local_f0._current.
      super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>_>._elem
      ._elem != (Value)0x0)) {
    plVar1 = (long *)((long)local_f0._current.
                            super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>_>
                            ._elem._elem + 8);
    *(int *)plVar1 = *(int *)plVar1 + -1;
    if (*(int *)plVar1 == 0) {
      (**(code **)(*(long *)local_f0._current.
                            super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>_>
                            ._elem._elem + 8))();
    }
  }
  ::Lib::
  OptionBase<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LeafIterator>
  ::~OptionBase(&local_f0._master._inner._current.
                 super_OptionBase<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LeafIterator>
               );
  if ((local_160._current.
       super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>_>.
       _isSome == true) &&
     (local_160._current.
      super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>_>._elem
      ._elem != (Value)0x0)) {
    plVar1 = (long *)((long)local_160._current.
                            super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>_>
                            ._elem._elem + 8);
    *(int *)plVar1 = *(int *)plVar1 + -1;
    if (*(int *)plVar1 == 0) {
      (**(code **)(*(long *)local_160._current.
                            super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>_>
                            ._elem._elem + 8))();
    }
  }
  ::Lib::
  OptionBase<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LeafIterator>
  ::~OptionBase(&local_160._master._inner._current.
                 super_OptionBase<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LeafIterator>
               );
  if ((local_178 == '\x01') && (local_170 != (long *)0x0)) {
    plVar1 = local_170 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    if ((int)*plVar1 == 0) {
      (**(code **)(*local_170 + 8))();
    }
  }
  ::Lib::
  OptionBase<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LeafIterator>
  ::~OptionBase(&local_1a8);
  ::Lib::
  OptionBase<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LeafIterator>
  ::~OptionBase(&local_68._iter._current.
                 super_OptionBase<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LeafIterator>
               );
  return (VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs>)
         (IteratorCore<Inferences::ALASCA::BinaryResolutionConf::Rhs> *)this;
}

Assistant:

VirtualIterator<LeafData> getAll() final override
  {
    return pvi(
          iterTraits(getRangeIterator((unsigned long)0, _trees.size()))
           .flatMap([this](auto i) { return LeafIterator(_trees[i].get()); })
           .flatMap([](Leaf* l) { return l->allChildren(); })
           // TODO get rid of copying data here
           .map([](LeafData const* ld) { return *ld; })
        );
  }